

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

void __thiscall LexerTest_LexKeywords_Test::TestBody(LexerTest_LexKeywords_Test *this)

{
  char *pcVar1;
  char *in_R9;
  string_view buffer;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 local_b8 [8];
  Lexer lexer;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_58 [2];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  local_e0._M_engaged = false;
  buffer._M_str = "module type func import rEsErVeD";
  buffer._M_len = 0x20;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_b8,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e0);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_e0);
  ::wasm::WATParser::Lexer::takeKeyword();
  local_38._M_len = 6;
  local_38._M_str = "module";
  testing::internal::
  CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
            (local_28,"lexer.takeKeyword()","\"module\"sv",
             (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             &local_58[0]._M_value,&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58[0]._M_value);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a8,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_38,(Message *)&local_58[0]._M_value);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    ::wasm::WATParser::Lexer::takeKeyword();
    local_38._M_len = 4;
    local_38._M_str = "type";
    testing::internal::
    CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
              (local_28,"lexer.takeKeyword()","\"type\"sv",
               (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               &local_58[0]._M_value,&local_38);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58[0]._M_value);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x3a9,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_38,(Message *)&local_58[0]._M_value);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      ::wasm::WATParser::Lexer::takeKeyword();
      local_38._M_len = 4;
      local_38._M_str = "func";
      testing::internal::
      CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
                (local_28,"lexer.takeKeyword()","\"func\"sv",
                 (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &local_58[0]._M_value,&local_38);
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58[0]._M_value);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x3aa,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_38,(Message *)&local_58[0]._M_value);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar);
        ::wasm::WATParser::Lexer::takeKeyword();
        local_38._M_len = 6;
        local_38._M_str = "import";
        testing::internal::
        CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
                  (local_28,"lexer.takeKeyword()","\"import\"sv",
                   (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_58[0]._M_value,&local_38);
        if (local_28[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58[0]._M_value);
          if (gtest_ar._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x3ab,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_38,(Message *)&local_58[0]._M_value);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          ::wasm::WATParser::Lexer::takeKeyword();
          local_38._M_len = 8;
          local_38._M_str = "rEsErVeD";
          testing::internal::
          CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
                    (local_28,"lexer.takeKeyword()","\"rEsErVeD\"sv",
                     (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_58[0]._M_value,&local_38);
          if (local_28[0] != (internal)0x0) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar);
            gtest_ar.success_ = false;
            gtest_ar._1_7_ = 0;
            local_28[0] = (internal)
                          (local_b8 ==
                          (undefined1  [8])
                          lexer.file.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_);
            if (!(bool)local_28[0]) {
              testing::Message::Message((Message *)&local_38);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_58[0]._M_value,local_28,(AssertionResult *)"lexer.empty()"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&lexer.buffer._M_str,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x3ad,(char *)local_58[0]._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&lexer.buffer._M_str,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lexer.buffer._M_str);
              std::__cxx11::string::~string((string *)&local_58[0]._M_value);
              if ((long *)local_38._M_len != (long *)0x0) {
                (**(code **)(*(long *)local_38._M_len + 8))();
              }
            }
            goto LAB_00221096;
          }
          testing::Message::Message((Message *)&local_58[0]._M_value);
          if (gtest_ar._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x3ac,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_38,(Message *)&local_58[0]._M_value);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((long *)local_58[0]._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58[0]._0_8_ + 8))();
  }
LAB_00221096:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  ::wasm::WATParser::Lexer::~Lexer((Lexer *)local_b8);
  return;
}

Assistant:

TEST(LexerTest, LexKeywords) {
  Lexer lexer("module type func import rEsErVeD");
  ASSERT_EQ(lexer.takeKeyword(), "module"sv);
  ASSERT_EQ(lexer.takeKeyword(), "type"sv);
  ASSERT_EQ(lexer.takeKeyword(), "func"sv);
  ASSERT_EQ(lexer.takeKeyword(), "import"sv);
  ASSERT_EQ(lexer.takeKeyword(), "rEsErVeD"sv);
  ASSERT_TRUE(lexer.empty());
}